

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O2

void __thiscall
nuraft::asio_rpc_listener::remove_session(asio_rpc_listener *this,ptr<rpc_session> *session)

{
  const_iterator __position;
  
  std::mutex::lock(&this->session_lock_);
  __position._M_current =
       (this->active_sessions_).
       super__Vector_base<std::shared_ptr<nuraft::rpc_session>,_std::allocator<std::shared_ptr<nuraft::rpc_session>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (__position._M_current ==
        (this->active_sessions_).
        super__Vector_base<std::shared_ptr<nuraft::rpc_session>,_std::allocator<std::shared_ptr<nuraft::rpc_session>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
LAB_001dbe27:
      pthread_mutex_unlock((pthread_mutex_t *)&this->session_lock_);
      return;
    }
    if (((__position._M_current)->
        super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
        (session->super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>)._M_ptr) {
      std::
      vector<std::shared_ptr<nuraft::rpc_session>,_std::allocator<std::shared_ptr<nuraft::rpc_session>_>_>
      ::erase(&this->active_sessions_,__position);
      goto LAB_001dbe27;
    }
    __position._M_current = __position._M_current + 1;
  } while( true );
}

Assistant:

void remove_session(const ptr<rpc_session>& session) {
        auto_lock(session_lock_);

        for (auto it = active_sessions_.begin();
             it != active_sessions_.end(); ++it) {
            if (*it == session) {
                active_sessions_.erase(it);
                break;
            }
        }
    }